

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_import(ptls_context_t *ctx,ptls_t **tls,ptls_iovec_t params)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ptls_t *ppVar8;
  ulong uVar9;
  ptls_cipher_suite_t *ppVar10;
  ptls_key_schedule_t *ppVar11;
  ushort uVar12;
  ulong uVar13;
  ptls_cipher_suite_t **pppVar14;
  ushort *puVar15;
  ushort *puVar16;
  byte *pbVar17;
  ushort *local_38;
  
  uVar13 = params.len;
  puVar15 = (ushort *)params.base;
  *tls = (ptls_t *)0x0;
  if (uVar13 < 2) {
    return 0x32;
  }
  uVar9 = (ulong)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
  if ((uVar13 - 2 < uVar9) || (uVar9 < 2)) {
LAB_0011059a:
    iVar7 = 0x32;
  }
  else {
    ppVar8 = new_instance(ctx,(uint)(byte)puVar15[1]);
    *tls = ppVar8;
    if (ppVar8 == (ptls_t *)0x0) {
      return 0x201;
    }
    pbVar17 = (byte *)((long)(puVar15 + 1) + uVar9);
    ppVar8->field_0x1e8 = ppVar8->field_0x1e8 & 0xfd | *(char *)((long)puVar15 + 3) * '\x02' & 2U;
    if ((((long)(pbVar17 + (-4 - (long)puVar15)) < 2) ||
        ((long)(pbVar17 + (-6 - (long)puVar15)) < 2)) ||
       ((long)pbVar17 - (long)(puVar15 + 4) < 0x20)) goto LAB_0011059a;
    uVar2 = puVar15[2];
    uVar3 = puVar15[3];
    ppVar8 = *tls;
    uVar4 = *(undefined8 *)(puVar15 + 4);
    uVar5 = *(undefined8 *)(puVar15 + 8);
    uVar6 = *(undefined8 *)(puVar15 + 0x10);
    *(undefined8 *)(ppVar8->client_random + 0x10) = *(undefined8 *)(puVar15 + 0xc);
    *(undefined8 *)(ppVar8->client_random + 0x18) = uVar6;
    *(undefined8 *)ppVar8->client_random = uVar4;
    *(undefined8 *)(ppVar8->client_random + 8) = uVar5;
    if (pbVar17 + (-0x28 - (long)puVar15) < (byte *)0x2) goto LAB_0011059a;
    uVar9 = (ulong)(ushort)(puVar15[0x14] << 8 | puVar15[0x14] >> 8);
    puVar1 = puVar15 + 0x15;
    if ((ulong)((long)pbVar17 - (long)puVar1) < uVar9) goto LAB_0011059a;
    puVar16 = (ushort *)((long)puVar1 + uVar9);
    if (uVar9 == 0) {
      if (puVar1 == puVar16) goto LAB_00110606;
      goto LAB_0011059a;
    }
    iVar7 = ptls_set_server_name(*tls,(char *)puVar1,uVar9);
    if (iVar7 != 0) goto LAB_0011059f;
LAB_00110606:
    if ((ulong)((long)pbVar17 - (long)puVar16) < 2) goto LAB_0011059a;
    uVar9 = (ulong)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
    puVar16 = puVar16 + 1;
    if ((ulong)((long)pbVar17 - (long)puVar16) < uVar9) goto LAB_0011059a;
    puVar1 = (ushort *)((long)puVar16 + uVar9);
    if (uVar9 == 0) {
      if (puVar16 != puVar1) goto LAB_0011059a;
    }
    else {
      iVar7 = ptls_set_negotiated_protocol(*tls,(char *)puVar16,uVar9);
      puVar16 = puVar1;
      if (iVar7 != 0) goto LAB_0011059f;
    }
    if ((ulong)((long)pbVar17 - (long)puVar1) < 2) goto LAB_0011059a;
    uVar9 = (ulong)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
    local_38 = puVar16 + 1;
    if ((ulong)((long)pbVar17 - (long)local_38) < uVar9) goto LAB_0011059a;
    uVar12 = uVar2 << 8 | uVar2 >> 8;
    uVar2 = uVar3 << 8 | uVar3 >> 8;
    puVar1 = (ushort *)((long)local_38 + uVar9);
    if (uVar12 == 0x304) {
      pppVar14 = ctx->cipher_suites;
      if (pppVar14 != (ptls_cipher_suite_t **)0x0) {
        ppVar10 = *pppVar14;
        while (ppVar10 != (ptls_cipher_suite_t *)0x0) {
          pppVar14 = pppVar14 + 1;
          if (ppVar10->id == uVar2) goto LAB_00110772;
          ppVar10 = *pppVar14;
        }
      }
      ppVar10 = (ptls_cipher_suite_t *)0x0;
LAB_00110772:
      (*tls)->cipher_suite = ppVar10;
      ppVar8 = *tls;
      if (ppVar8->cipher_suite == (ptls_cipher_suite_t *)0x0) {
LAB_0011086b:
        iVar7 = 0x28;
        goto LAB_001105a7;
      }
      ppVar11 = key_schedule_new(ppVar8->cipher_suite,(ptls_cipher_suite_t **)0x0,
                                 (uint)((ppVar8->ech).aead != (ptls_aead_context_t *)0x0));
      (*tls)->key_schedule = ppVar11;
      if (ppVar11 == (ptls_key_schedule_t *)0x0) {
        iVar7 = 0x201;
      }
      else {
        iVar7 = import_tls13_traffic_protection(*tls,1,(uint8_t **)&local_38,(uint8_t *)puVar1);
        if (iVar7 == 0) {
          iVar7 = import_tls13_traffic_protection(*tls,0,(uint8_t **)&local_38,(uint8_t *)puVar1);
LAB_001107e9:
          if (iVar7 == 0) {
            if (((local_38 != puVar1) || ((ulong)((long)pbVar17 - (long)puVar1) < 2)) ||
               ((uVar9 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8),
                (ulong)((long)pbVar17 - (long)(local_38 + 1)) < uVar9 ||
                ((byte *)((long)local_38 + uVar9 + 2) != pbVar17)))) goto LAB_0011059a;
            iVar7 = 0x32;
            if (pbVar17 == (byte *)((long)puVar15 + uVar13)) {
              (*tls)->state = ((byte)(*tls)->field_0x1e8 & 1) + PTLS_STATE_CLIENT_POST_HANDSHAKE;
              return 0;
            }
          }
        }
      }
    }
    else {
      iVar7 = 0x2f;
      if (uVar12 == 0x303) {
        pppVar14 = ctx->tls12_cipher_suites;
        if (pppVar14 != (ptls_cipher_suite_t **)0x0) {
          ppVar10 = *pppVar14;
          while (ppVar10 != (ptls_cipher_suite_t *)0x0) {
            pppVar14 = pppVar14 + 1;
            if (ppVar10->id == uVar2) goto LAB_001106f5;
            ppVar10 = *pppVar14;
          }
        }
        ppVar10 = (ptls_cipher_suite_t *)0x0;
LAB_001106f5:
        (*tls)->cipher_suite = ppVar10;
        ppVar8 = *tls;
        if (ppVar8->cipher_suite == (ptls_cipher_suite_t *)0x0) goto LAB_0011086b;
        iVar7 = import_tls12_traffic_protection(ppVar8,1,(uint8_t **)&local_38,(uint8_t *)puVar1);
        if (iVar7 == 0) {
          iVar7 = import_tls12_traffic_protection(*tls,0,(uint8_t **)&local_38,(uint8_t *)puVar1);
          goto LAB_001107e9;
        }
      }
    }
  }
LAB_0011059f:
  ppVar8 = *tls;
  if (ppVar8 == (ptls_t *)0x0) {
    return iVar7;
  }
LAB_001105a7:
  ptls_free(ppVar8);
  *tls = (ptls_t *)0x0;
  return iVar7;
}

Assistant:

int ptls_import(ptls_context_t *ctx, ptls_t **tls, ptls_iovec_t params)
{
    const uint8_t *src = params.base, *const end = src + params.len;
    uint16_t protocol_version, csid;
    int ret;

    *tls = NULL;

    /* TODO handle flags like psk_handshake, ech_handshake as we add support for TLS/1.3 import */
    ptls_decode_block(src, end, 2, {
        /* instantiate, based on the is_server flag */
        if (end - src < 2) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((*tls = new_instance(ctx, *src++)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        (*tls)->is_psk_handshake = *src++;
        /* determine protocol version and cipher suite */
        if ((ret = ptls_decode16(&protocol_version, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        /* other version-independent stuff */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        memcpy((*tls)->client_random, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_server_name(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_negotiated_protocol(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        /* version-dependent stuff */
        ptls_decode_open_block(src, end, 2, {
            switch (protocol_version) {
            case PTLS_PROTOCOL_VERSION_TLS12:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->tls12_cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if ((ret = import_tls12_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls12_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            case PTLS_PROTOCOL_VERSION_TLS13:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if (((*tls)->key_schedule = key_schedule_new((*tls)->cipher_suite, NULL, (*tls)->ech.aead != NULL)) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                if ((ret = import_tls13_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls13_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        /* extensions */
        ptls_decode_open_block(src, end, 2, {
            src = end; /* unused */
        });
    });

    (*tls)->state = ptls_is_server(*tls) ? PTLS_STATE_SERVER_POST_HANDSHAKE : PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    if (ret != 0) {
        if (*tls != NULL) {
            ptls_free(*tls);
            *tls = NULL;
        }
    }
    return ret;
}